

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffcrimll(fitsfile *fptr,int bitpix,int naxis,LONGLONG *naxes,int *status)

{
  int *in_RDI;
  fitsfile *in_R8;
  LONGLONG in_stack_000001c8;
  LONGLONG *in_stack_000001d0;
  int in_stack_000001dc;
  int in_stack_000001e0;
  int in_stack_000001e4;
  fitsfile *in_stack_000001e8;
  LONGLONG in_stack_00000200;
  int in_stack_00000208;
  int *in_stack_00000210;
  int *in_stack_ffffffffffffffd0;
  int local_4;
  
  if (in_R8->HDUposition < 1) {
    if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      ffmahd(fptr,bitpix,(int *)naxes,status);
    }
    if (*(long *)(*(long *)(in_RDI + 2) + 0x70) !=
        *(long *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) +
                 (long)*(int *)(*(long *)(in_RDI + 2) + 0x54) * 8)) {
      ffcrhd(in_R8,in_stack_ffffffffffffffd0);
    }
    ffphprll(in_stack_000001e8,in_stack_000001e4,in_stack_000001e0,in_stack_000001dc,
             in_stack_000001d0,in_stack_000001c8,in_stack_00000200,in_stack_00000208,
             in_stack_00000210);
    local_4 = in_R8->HDUposition;
  }
  else {
    local_4 = in_R8->HDUposition;
  }
  return local_4;
}

Assistant:

int ffcrimll(fitsfile *fptr,    /* I - FITS file pointer           */
           int bitpix,          /* I - bits per pixel              */
           int naxis,           /* I - number of axes in the array */
           LONGLONG *naxes,     /* I - size of each axis           */
           int *status)         /* IO - error status               */
/*
  create an IMAGE extension following the current HDU. If the
  current HDU is empty (contains no header keywords), then simply
  write the required image (or primary array) keywords to the current
  HDU. 
*/
{
    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    /* create new extension if current header is not empty */
    if ((fptr->Fptr)->headend != (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] )
        ffcrhd(fptr, status);

    /* write the required header keywords */
    ffphprll(fptr, TRUE, bitpix, naxis, naxes, 0, 1, TRUE, status);

    return(*status);
}